

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool CheckFunctionForInlining(VmFunction *function)

{
  VmInstructionType VVar1;
  uint uVar2;
  VmBlock *pVVar3;
  VmValue **ppVVar4;
  uint uVar5;
  uint uVar6;
  VmBlock **ppVVar7;
  VmInstruction *pVVar8;
  uint uVar9;
  VmFunction *pVVar10;
  bool bVar11;
  
  if (function->firstBlock != (VmBlock *)0x0) {
    uVar6 = 0;
    if ((function->restoreBlocks).count != 0) {
      return false;
    }
    ppVVar7 = &function->firstBlock;
    do {
      pVVar3 = *ppVVar7;
      if (pVVar3 == (VmBlock *)0x0) {
        return pVVar3 == (VmBlock *)0x0;
      }
      if (pVVar3->nextSibling != (VmBlock *)0x0) {
        return false;
      }
      pVVar8 = pVVar3->firstInstruction;
      bVar11 = pVVar8 == (VmInstruction *)0x0;
      uVar5 = uVar6;
      if (!bVar11) {
        uVar9 = uVar6 + 1;
        if (uVar9 < 0x12) {
          uVar9 = 0x11;
        }
        do {
          VVar1 = pVVar8->cmd;
          uVar5 = uVar6;
          if (VVar1 == VM_INST_CALL) {
            uVar2 = (pVVar8->arguments).count;
            if (uVar2 == 0) {
LAB_001a870f:
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                           );
            }
            ppVVar4 = (pVVar8->arguments).data;
            if (((*ppVVar4)->type).type != VM_TYPE_FUNCTION_REF) {
              if (uVar2 == 1) goto LAB_001a870f;
              pVVar10 = (VmFunction *)ppVVar4[1];
              if ((pVVar10 == (VmFunction *)0x0) || ((pVVar10->super_VmValue).typeID != 4)) {
                pVVar10 = (VmFunction *)0x0;
              }
              if (pVVar10 == function) break;
            }
          }
          else if ((VVar1 == VM_INST_YIELD) || (VVar1 == VM_INST_ABORT_NO_RETURN)) break;
          uVar6 = uVar6 + 1;
          uVar5 = uVar9;
          if (0x10 < uVar6) break;
          pVVar8 = pVVar8->nextSibling;
          bVar11 = pVVar8 == (VmInstruction *)0x0;
          uVar5 = uVar6;
        } while (!bVar11);
      }
      uVar6 = uVar5;
      ppVVar7 = &pVVar3->nextSibling;
    } while (bVar11);
  }
  return false;
}

Assistant:

bool CheckFunctionForInlining(VmFunction *function)
{
	// Can't inline external function
	if(!function->firstBlock)
		return false;

	// Can't inline coroutines
	if(!function->restoreBlocks.empty())
		return false;

	unsigned instructions = 0;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// TODO: remove single block limit
		if(curr->nextSibling)
			return false;

		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_ABORT_NO_RETURN || inst->cmd == VM_INST_YIELD)
				return false;

			if(inst->cmd == VM_INST_CALL && inst->arguments[0]->type.type != VM_TYPE_FUNCTION_REF)
			{
				VmFunction *targetFunction = getType<VmFunction>(inst->arguments[1]);

				// Can't inline recursive call
				if(function == targetFunction)
					return false;
			}

			// Simplest heuristic, inline small functions
			if(++instructions > 16)
				return false;
		}
	}

	return true;
}